

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateInnerProductLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  bool bVar1;
  InnerProductLayerParams *pIVar2;
  WeightParams *bias;
  Result *_result;
  WeightParams *pWVar3;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    this_00 = &__return_storage_ptr__->m_message;
    std::__cxx11::string::~string((string *)this_00);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      std::__cxx11::string::~string((string *)this_00);
      if (this->ndArrayInterpretation == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"InnerProduct",(allocator<char> *)&local_68);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,layer,&local_48,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_48);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"InnerProduct",&local_69);
        validateRankCount(__return_storage_ptr__,layer,&local_68,1,5,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_68);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      pIVar2 = Specification::NeuralNetworkLayer::innerproduct(layer);
      if (pIVar2->int8dynamicquantize_ == true) {
        pWVar3 = pIVar2->weights_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"InnerProduct",&local_69);
        if (pWVar3 == (WeightParams *)0x0) {
          pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        validateInt8Requirements(__return_storage_ptr__,pWVar3,&local_68,(layer->name_).ptr_);
        std::__cxx11::string::~string((string *)&local_68);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
      pWVar3 = pIVar2->weights_;
      if (pWVar3 == (WeightParams *)0x0) {
        pWVar3 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      bias = pIVar2->bias_;
      if (bias == (WeightParams *)0x0) {
        bias = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      validateInnerProductWeightsBias(__return_storage_ptr__,layer,pWVar3,bias);
      bVar1 = Result::good(__return_storage_ptr__);
      if (bVar1) {
        std::__cxx11::string::~string((string *)this_00);
        Result::Result(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateInnerProductLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "InnerProduct", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "InnerProduct", 1, 5, blobNameToRank));
    }

    const auto& params = layer.innerproduct();
    if (params.int8dynamicquantize()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInt8Requirements(params.weights(), "InnerProduct", layer.name()));
    }

    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInnerProductWeightsBias(layer, params.weights(), params.bias()));
    return Result();
}